

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O3

void manage_thrashing_behavior
               (vector<ProcessProgress,_std::allocator<ProcessProgress>_> *child_processes,
               StallState *old_state,StallState *new_state)

{
  int64_t iVar1;
  bool bVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  float fVar9;
  
  iVar4 = Global::running_processes;
  bVar2 = false;
  iVar8 = new_state->dirty_pages_mib - old_state->dirty_pages_mib;
  if ((new_state->dirty_pages_mib | old_state->dirty_pages_mib) < 0) {
    iVar8 = 0;
  }
  if ((new_state->io_stalled_us | old_state->io_stalled_us) < 0) {
    fVar9 = -1.0;
  }
  else {
    fVar9 = (float)(new_state->io_stalled_us - old_state->io_stalled_us) /
            ((float)(new_state->timestamp_ns - old_state->timestamp_ns) * 0.001);
  }
  bVar6 = false;
  if (Global::target_running_processes_dirty_pages == '\0') {
    if (iVar8 < 0x33) {
      bVar6 = iVar8 < -10;
      bVar2 = false;
    }
    else {
      bVar2 = true;
      bVar6 = false;
    }
  }
  if (1.0 <= fVar9) {
    fVar9 = 1.0;
  }
  if ((Global::target_running_processes_io_stall == '\0') && (0.0 <= fVar9)) {
    if (fVar9 <= 0.3) {
      if (fVar9 < 0.1) {
        bVar6 = true;
      }
    }
    else {
      bVar2 = true;
    }
  }
  if (Global::control_block != 0) {
    iVar8 = -1;
    if (0.0 <= fVar9) {
      iVar8 = (int)(fVar9 * 100.0);
    }
    *(int *)(Global::control_block + 0xc90) = iVar8;
  }
  uVar5 = 1;
  if (iVar4 != 0) {
    uVar5 = (uint)bVar6;
  }
  uVar7 = -(uint)(iVar4 != 0) | uVar5;
  if (!bVar2) {
    uVar7 = uVar5;
  }
  old_state->timestamp_ns = new_state->timestamp_ns;
  uVar3 = *(undefined4 *)&new_state->field_0x4;
  iVar1 = new_state->io_stalled_us;
  old_state->dirty_pages_mib = new_state->dirty_pages_mib;
  *(undefined4 *)&old_state->field_0x4 = uVar3;
  old_state->io_stalled_us = iVar1;
  uVar5 = (uint)((ulong)((long)(child_processes->
                               super__Vector_base<ProcessProgress,_std::allocator<ProcessProgress>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(child_processes->
                              super__Vector_base<ProcessProgress,_std::allocator<ProcessProgress>_>)
                              ._M_impl.super__Vector_impl_data._M_start) >> 7);
  Global::target_running_processes = uVar7 + iVar4;
  if (uVar5 <= uVar7 + iVar4) {
    Global::target_running_processes = uVar5;
  }
  return;
}

Assistant:

static void manage_thrashing_behavior(std::vector<ProcessProgress> &child_processes,
                                      StallState &old_state, const StallState &new_state)
{
	// It is quite easy to overload the system with IO if we're not careful, so check for this.

	float delta_us = 1e-3f * float(new_state.timestamp_ns - old_state.timestamp_ns);
	float io_stall_us = float(new_state.io_stalled_us - old_state.io_stalled_us);

	int32_t delta_dirty_pages_mib = 0;
	if (new_state.dirty_pages_mib >= 0 && old_state.dirty_pages_mib >= 0)
		delta_dirty_pages_mib = new_state.dirty_pages_mib - old_state.dirty_pages_mib;

	float io_stall_ratio = -1.0f;
	if (new_state.io_stalled_us >= 0 && old_state.io_stalled_us >= 0)
		io_stall_ratio = io_stall_us / delta_us;
	io_stall_ratio = std::min(1.0f, io_stall_ratio);

	unsigned target_running_processes = Global::running_processes;

	// Some heuristics here.
	bool go_down = false;
	bool go_up = false;

	if (Global::target_running_processes_dirty_pages)
	{
		if (delta_dirty_pages_mib > 50)
		{
			// If we (or someone else) created more than 50 MiB of dirty data in this tick,
			// we should lower number of processes.
			go_down = true;
		}
		else if (delta_dirty_pages_mib < -10)
		{
			// Dirty pages is going down, can increase CPU load now.
			go_up = true;
		}
	}

	// IO stalls usually means someone is hammering IO.
	// We don't want to contribute to that.
	if (Global::target_running_processes_io_stall && io_stall_ratio >= 0.0f)
	{
		if (io_stall_ratio > 0.3f)
			go_down = true;
		else if (io_stall_ratio < 0.1f)
			go_up = true;
	}

	// Ensure forward progress. Make at least one process active
	// if we have had a period of complete sleep.
	if (target_running_processes == 0)
		go_up = true;

	if (go_down && target_running_processes)
		target_running_processes--;
	else if (go_up)
		target_running_processes++;

	if (Global::control_block)
	{
		Global::control_block->io_stall_percentage.store(
				io_stall_ratio < 0.0f ? -1 : int32_t(io_stall_ratio * 100.0f),
				std::memory_order_relaxed);
	}

	old_state = new_state;

	target_running_processes = std::min<unsigned>(target_running_processes, child_processes.size());
	Global::target_running_processes = target_running_processes;
}